

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

void __thiscall pstore::file::file_base::read<pstore::header,void>(file_base *this,header *t)

{
  int iVar1;
  undefined4 extraout_var;
  not_null<void_*> local_18;
  
  if (t == (header *)0x0) {
    assert_failed("t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/os/file.hpp"
                  ,0xe7);
  }
  local_18.ptr_ = t;
  gsl::not_null<void_*>::ensure_invariant(&local_18);
  iVar1 = (*this->_vptr_file_base[0xd])(this,local_18.ptr_,0x30);
  if (CONCAT44(extraout_var,iVar1) == 0x30) {
    return;
  }
  raise<pstore::error_code>(did_not_read_number_of_bytes_requested);
}

Assistant:

void read (T * const t) {
                PSTORE_ASSERT (t != nullptr);
                if (this->read_buffer (t, sizeof (T)) != sizeof (T)) {
                    raise (error_code::did_not_read_number_of_bytes_requested);
                }
            }